

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threading.cpp
# Opt level: O0

void cinemo::threading::doSingleThreadedConversion
               (vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_> *lw,
               Options *options)

{
  bool bVar1;
  ostream *poVar2;
  EVP_PKEY_CTX *ctx;
  undefined1 local_58 [40];
  LameWrapper **work;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_> *__range2;
  Options *options_local;
  vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_> *lw_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"\nSingle-threaded conversion is in progress...");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  __end2 = std::vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>::begin(lw);
  work = (LameWrapper **)
         std::vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>::end(lw);
  while( true ) {
    ctx = (EVP_PKEY_CTX *)&work;
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<cinemo::LameWrapper_*const_*,_std::vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>_>
                                *)ctx);
    if (!bVar1) break;
    local_58._32_8_ =
         __gnu_cxx::
         __normal_iterator<cinemo::LameWrapper_*const_*,_std::vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>_>
         ::operator*(&__end2);
    LameWrapper::init(*(LameWrapper **)local_58._32_8_,ctx);
    poVar2 = std::operator<<((ostream *)&std::cout,"MainThread");
    poVar2 = std::operator<<(poVar2," => ");
    LameWrapper::getFileName_abi_cxx11_((LameWrapper *)local_58);
    poVar2 = std::operator<<(poVar2,(string *)local_58);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_58);
    if ((options->verbose & 1U) != 0) {
      LameWrapper::printWaveInfo(*(LameWrapper **)local_58._32_8_);
    }
    LameWrapper::convertToMp3(*(LameWrapper **)local_58._32_8_);
    __gnu_cxx::
    __normal_iterator<cinemo::LameWrapper_*const_*,_std::vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void doSingleThreadedConversion(const vector<LameWrapper*>& lw,
                                        const args::Options& options) {
            cout << "\nSingle-threaded conversion is in progress..." << endl;

            for (auto& work : lw) {
				work->init();
				cout << "MainThread" << " => " << work->getFileName()
					<< endl;
                if (options.verbose) {
                    work->printWaveInfo();
                }
                work->convertToMp3();
            }
        }